

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

Status __thiscall leveldb::anon_unknown_1::PosixWritableFile::Sync(PosixWritableFile *this)

{
  Status SVar1;
  int fd;
  int *piVar2;
  long in_RSI;
  long in_FS_OFFSET;
  Status status;
  WritableFile local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  status.state_ = (char *)0x0;
  if (*(char *)(in_RSI + 0x10014) == '\x01') {
    fd = open(*(char **)(in_RSI + 0x10038),0x80000);
    if (fd < 0) {
      piVar2 = __errno_location();
      PosixError((anon_unknown_1 *)&stack0xffffffffffffffd0,(string *)(in_RSI + 0x10038),*piVar2);
      status.state_ = (char *)local_30._vptr_WritableFile;
      local_30._vptr_WritableFile = (_func_int **)0x0;
      Status::~Status((Status *)&stack0xffffffffffffffd0);
    }
    else {
      SyncFd((PosixWritableFile *)&stack0xffffffffffffffd0,fd,(string *)(in_RSI + 0x10038),true);
      status.state_ = (char *)local_30._vptr_WritableFile;
      local_30._vptr_WritableFile = (_func_int **)0x0;
      Status::~Status((Status *)&stack0xffffffffffffffd0);
      close(fd);
    }
    if (status.state_ == (char *)0x0) goto LAB_0055be4a;
  }
  else {
LAB_0055be4a:
    FlushBuffer((PosixWritableFile *)&stack0xffffffffffffffd0);
    SVar1 = status;
    status.state_ = (char *)local_30._vptr_WritableFile;
    local_30._vptr_WritableFile = (_func_int **)SVar1.state_;
    Status::~Status((Status *)&stack0xffffffffffffffd0);
    if (status.state_ == (char *)0x0) {
      SyncFd(this,*(int *)(in_RSI + 0x10010),(string *)(in_RSI + 0x10018),false);
      goto LAB_0055be9d;
    }
  }
  (this->super_WritableFile)._vptr_WritableFile = (_func_int **)status.state_;
  status.state_ = (char *)0x0;
LAB_0055be9d:
  Status::~Status(&status);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status Sync() override {
    // Ensure new files referred to by the manifest are in the filesystem.
    //
    // This needs to happen before the manifest file is flushed to disk, to
    // avoid crashing in a state where the manifest refers to files that are not
    // yet on disk.
    Status status = SyncDirIfManifest();
    if (!status.ok()) {
      return status;
    }

    status = FlushBuffer();
    if (!status.ok()) {
      return status;
    }

    return SyncFd(fd_, filename_, false);
  }